

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O3

EntryType * __thiscall
JsUtil::
BaseDictionary<Js::InternalString,_UnifiedRegex::RegexStats_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::DictionaryEntry,_JsUtil::NoResizeLock>
::AllocateEntries(BaseDictionary<Js::InternalString,_UnifiedRegex::RegexStats_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::DictionaryEntry,_JsUtil::NoResizeLock>
                  *this,int size,bool zeroAllocate)

{
  undefined1 auVar1 [16];
  EntryType *pEVar2;
  code *AllocFunc;
  size_t byteSize;
  long lVar3;
  
  if (size != 0) {
    if (zeroAllocate) {
      AllocFunc = Memory::ArenaAllocator::AllocZero;
    }
    else {
      AllocFunc = Memory::ArenaAllocator::Alloc;
    }
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)size;
    byteSize = 0xffffffffffffffff;
    if (SUB168(auVar1 * ZEXT816(0x28),8) == 0) {
      byteSize = SUB168(auVar1 * ZEXT816(0x28),0);
    }
    lVar3 = 0;
    pEVar2 = (EntryType *)
             new__<Memory::ArenaAllocator>
                       (byteSize,this->alloc,(offset_in_ArenaAllocator_to_subr)AllocFunc);
    do {
      *(undefined4 *)
       ((long)&(pEVar2->
               super_CacheHashedEntry<Js::InternalString,_UnifiedRegex::RegexStats_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
               ).super_KeyValueEntry<Js::InternalString,_UnifiedRegex::RegexStats_*>.
               super_ValueEntry<UnifiedRegex::RegexStats_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Js::InternalString,_UnifiedRegex::RegexStats_*>_>
               .super_KeyValueEntryDataLayout2<Js::InternalString,_UnifiedRegex::RegexStats_*>.key.
               m_charLength + lVar3) = 0;
      (&(pEVar2->
        super_CacheHashedEntry<Js::InternalString,_UnifiedRegex::RegexStats_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
        ).super_KeyValueEntry<Js::InternalString,_UnifiedRegex::RegexStats_*>.
        super_ValueEntry<UnifiedRegex::RegexStats_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Js::InternalString,_UnifiedRegex::RegexStats_*>_>
        .super_KeyValueEntryDataLayout2<Js::InternalString,_UnifiedRegex::RegexStats_*>.key.m_offset
      )[lVar3] = '\0';
      *(undefined8 *)
       ((long)&(pEVar2->
               super_CacheHashedEntry<Js::InternalString,_UnifiedRegex::RegexStats_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
               ).super_KeyValueEntry<Js::InternalString,_UnifiedRegex::RegexStats_*>.
               super_ValueEntry<UnifiedRegex::RegexStats_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Js::InternalString,_UnifiedRegex::RegexStats_*>_>
               .super_KeyValueEntryDataLayout2<Js::InternalString,_UnifiedRegex::RegexStats_*>.key.
               m_content.ptr + lVar3) = 0;
      lVar3 = lVar3 + 0x28;
    } while ((long)size * 0x28 != lVar3);
    return pEVar2;
  }
  return (EntryType *)&DAT_00000008;
}

Assistant:

inline T * AllocateArray(TAllocator * allocator, char * (TAllocator::*AllocFunc)(size_t), DECLSPEC_GUARD_OVERFLOW size_t count)
{
    if (count == 0 && TAllocator::FakeZeroLengthArray)
    {
#ifdef TRACK_ALLOC
        allocator->ClearTrackAllocInfo();
#endif
        // C++ standard requires allocator to return non-null if it isn't out of memory
        // Just return some small number so we will still AV if someone try to use the memory
        return (T *)ZERO_LENGTH_ARRAY;
    }
    if (nothrow)
    {
        return new (allocator, nothrow, AllocFunc) T[count];
    }
    return new (allocator, AllocFunc) T[count];
}